

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O3

long helics::varMax<long>
               (vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>
                *vals)

{
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *pvVar1;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar2;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *dval;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *__v;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  vVar3;
  
  pvVar2 = std::
           get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     ((vals->
                      super__Vector_base<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
  vVar3 = *pvVar2;
  pvVar1 = (vals->
           super__Vector_base<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__v = (vals->
             super__Vector_base<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __v != pvVar1; __v = __v + 1) {
    pvVar2 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (__v);
    if (vVar3 < *pvVar2) {
      pvVar2 = std::
               get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         (__v);
      vVar3 = *pvVar2;
    }
  }
  return vVar3;
}

Assistant:

X varMax(const std::vector<defV>& vals)
{
    X dmax = std::get<X>(vals.front());
    for (const auto& dval : vals) {
        if (std::get<X>(dval) > dmax) {
            dmax = std::get<X>(dval);
        }
    }
    return dmax;
}